

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AnalysisManager.cpp
# Opt level: O1

void __thiscall
slang::analysis::AnalysisManager::AnalysisManager(AnalysisManager *this,AnalysisOptions options)

{
  ulong uVar1;
  allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>
  local_2d;
  equal_to<const_slang::ast::Scope_*> local_2c;
  hash<const_slang::ast::Scope_*,_void> local_2b;
  anon_class_1_0_00000001_for_init local_2a [2];
  
  uVar1 = options._0_8_;
  (this->options).flags = (bitmask<slang::analysis::AnalysisFlags>)(int)uVar1;
  (this->options).numThreads = (int)(uVar1 >> 0x20);
  (this->options).maxCaseAnalysisSteps = options.maxCaseAnalysisSteps;
  (this->workerStates).
  super__Vector_base<slang::analysis::AnalysisManager::WorkerState,_std::allocator<slang::analysis::AnalysisManager::WorkerState>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->workerStates).
  super__Vector_base<slang::analysis::AnalysisManager::WorkerState,_std::allocator<slang::analysis::AnalysisManager::WorkerState>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->workerStates).
  super__Vector_base<slang::analysis::AnalysisManager::WorkerState,_std::allocator<slang::analysis::AnalysisManager::WorkerState>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  boost::unordered::detail::foa::
  concurrent_table<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_slang::hash<const_slang::ast::Scope_*,_void>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
  ::concurrent_table(&(this->analyzedScopes).table_,0,&local_2b,&local_2c,&local_2d);
  BS::thread_pool<(unsigned_char)'\x00'>::
  thread_pool<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_source____external_BS_thread_pool_hpp:1262:84)>
            (&this->threadPool,uVar1 >> 0x20,local_2a);
  (this->mutex).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  (this->pendingException)._M_exception_object = (void *)0x0;
  *(undefined8 *)((long)&(this->mutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->mutex).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->mutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->mutex).super___mutex_base._M_mutex + 8) = 0;
  std::
  vector<slang::analysis::AnalysisManager::WorkerState,_std::allocator<slang::analysis::AnalysisManager::WorkerState>_>
  ::reserve(&this->workerStates,(this->threadPool).thread_count + 1);
  if ((this->threadPool).thread_count != 0xffffffffffffffff) {
    uVar1 = 0;
    do {
      std::
      vector<slang::analysis::AnalysisManager::WorkerState,std::allocator<slang::analysis::AnalysisManager::WorkerState>>
      ::emplace_back<slang::analysis::AnalysisManager&>
                ((vector<slang::analysis::AnalysisManager::WorkerState,std::allocator<slang::analysis::AnalysisManager::WorkerState>>
                  *)&this->workerStates,this);
      uVar1 = uVar1 + 1;
    } while (uVar1 < (this->threadPool).thread_count + 1);
  }
  return;
}

Assistant:

AnalysisManager::AnalysisManager(AnalysisOptions options) :
    options(options), threadPool(options.numThreads) {

    workerStates.reserve(threadPool.get_thread_count() + 1);
    for (size_t i = 0; i < threadPool.get_thread_count() + 1; i++)
        workerStates.emplace_back(*this);
}